

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O2

int tlsio_openssl_send(CONCRETE_IO_HANDLE tls_io,void *buffer,size_t size,
                      ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x605;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x605;
    }
    pcVar4 = "NULL tls_io.";
    iVar3 = 0x604;
  }
  else if (*(int *)((long)tls_io + 0x68) == 4) {
    if (*(SSL **)((long)tls_io + 0x48) == (SSL *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x616;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x616;
      }
      pcVar4 = "SSL channel closed in tlsio_openssl_send.";
      iVar3 = 0x615;
    }
    else {
      iVar1 = SSL_write(*(SSL **)((long)tls_io + 0x48),buffer,(int)size);
      if (iVar1 != (int)size) {
        log_ERR_get_error("SSL_write error.");
        return 0x61e;
      }
      iVar1 = write_outgoing_bytes((TLS_IO_INSTANCE *)tls_io,on_send_complete,callback_context);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x625;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x625;
      }
      pcVar4 = "Error in write_outgoing_bytes.";
      iVar3 = 0x624;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x60e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x60e;
    }
    pcVar4 = "Invalid tlsio_state. Expected state is TLSIO_STATE_OPEN.";
    iVar3 = 0x60d;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
            ,"tlsio_openssl_send",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int tlsio_openssl_send(CONCRETE_IO_HANDLE tls_io, const void* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    if (tls_io == NULL)
    {
        LogError("NULL tls_io.");
        result = MU_FAILURE;
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (tls_io_instance->tlsio_state != TLSIO_STATE_OPEN)
        {
            LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_OPEN.");
            result = MU_FAILURE;
        }
        else
        {
            int res;
            if (tls_io_instance->ssl == NULL)
            {
                LogError("SSL channel closed in tlsio_openssl_send.");
                result = MU_FAILURE;
                return result;
            }

            res = SSL_write(tls_io_instance->ssl, buffer, (int)size);
            if (res != (int)size)
            {
                log_ERR_get_error("SSL_write error.");
                result = MU_FAILURE;
            }
            else
            {
                if (write_outgoing_bytes(tls_io_instance, on_send_complete, callback_context) != 0)
                {
                    LogError("Error in write_outgoing_bytes.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
        }
    }

    return result;
}